

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O3

Pipeline * __thiscall duckdb::MetaPipeline::CreatePipeline(MetaPipeline *this)

{
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *this_00;
  PhysicalOperator *pPVar1;
  idx_t iVar2;
  reference pvVar3;
  type pPVar4;
  undefined1 local_39;
  shared_ptr<duckdb::Pipeline,_true> local_38;
  shared_ptr<duckdb::Pipeline> local_28;
  
  this_00 = &this->pipelines;
  local_28.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::Pipeline,std::allocator<duckdb::Pipeline>,duckdb::Executor&>
            (&local_28.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Pipeline **)&local_28,(allocator<duckdb::Pipeline> *)&local_39,this->executor);
  shared_ptr<duckdb::Pipeline,_true>::shared_ptr(&local_38,&local_28);
  if (local_28.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::Pipeline,true>>
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
              *)this_00,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pvVar3 = vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::back(this_00);
  pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator*(pvVar3);
  pPVar1 = (this->sink).ptr;
  iVar2 = this->next_batch_index;
  this->next_batch_index = iVar2 + 1;
  (pPVar4->sink).ptr = pPVar1;
  pPVar4->base_batch_index = iVar2 * 10000000000000;
  pvVar3 = vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::back(this_00);
  pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator*(pvVar3);
  return pPVar4;
}

Assistant:

Pipeline &MetaPipeline::CreatePipeline() {
	pipelines.emplace_back(make_shared_ptr<Pipeline>(executor));
	state.SetPipelineSink(*pipelines.back(), sink, next_batch_index++);
	return *pipelines.back();
}